

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

void __thiscall
Fixpp::Field<Fixpp::TagT<241U,_Fixpp::Type::String>_>::Field
          (Field<Fixpp::TagT<241U,_Fixpp::Type::String>_> *this,
          Field<Fixpp::TagT<241U,_Fixpp::Type::String>_> *other)

{
  Field<Fixpp::TagT<241U,_Fixpp::Type::String>_> *other_local;
  Field<Fixpp::TagT<241U,_Fixpp::Type::String>_> *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->empty_ = false;
  operator=(this,other);
  return;
}

Assistant:

Field(const Field& other)
        {
            operator=(other);
        }